

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupDfsSkip(Gia_Man_t *p)

{
  uint uVar1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p->pObjs->Value = 0;
  for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
    pGVar3 = Gia_ManCi(p,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar3->Value = uVar1;
  }
  for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
    pGVar3 = Gia_ManCo(p,iVar4);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if ((pGVar3->field_0x7 & 0x40) == 0) {
      Gia_ManDupDfs_rec(p_00,p,pGVar3);
    }
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfsSkip( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
        if ( pObj->fMark1 == 0 )
            Gia_ManDupDfs_rec( pNew, p, pObj );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}